

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O0

void __thiscall
QtMWidgets::PageControlPrivate::updateButtonsInfo(PageControlPrivate *this,int width)

{
  int iVar1;
  QRect local_24;
  int local_14;
  PageControlPrivate *pPStack_10;
  int width_local;
  PageControlPrivate *this_local;
  
  if (width < 1) {
    local_14 = width;
    pPStack_10 = this;
    local_24 = QWidget::rect(&this->q->super_QWidget);
    iVar1 = QRect::width(&local_24);
    this->widgetWidth = iVar1;
  }
  else {
    this->widgetWidth = width;
  }
  this->countInOneLine = this->widgetWidth / this->buttonSize;
  if (1 < this->countInOneLine) {
    this->countInLastLine = this->count % this->countInOneLine;
    this->linesCount = this->count / this->countInOneLine + (uint)(0 < this->countInLastLine);
    if (this->countInLastLine == 0) {
      this->countInLastLine = this->countInOneLine;
    }
  }
  return;
}

Assistant:

void
PageControlPrivate::updateButtonsInfo( int width )
{
	if( width <= 0 )
		widgetWidth = q->rect().width();
	else
		widgetWidth = width;

	countInOneLine = widgetWidth / buttonSize;

	if( countInOneLine > 1 )
	{
		countInLastLine = count % countInOneLine;

		linesCount = count / countInOneLine + ( countInLastLine > 0 ? 1 : 0 );

		if( countInLastLine == 0 )
			countInLastLine = countInOneLine;
	}
}